

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O3

bool __thiscall
HPack::Encoder::encodeResponse(Encoder *this,BitOStream *outputStream,HttpHeader *header)

{
  pointer pHVar1;
  bool bVar2;
  HeaderField *field;
  pointer field_00;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_44 = 0;
    local_40 = "default";
    bVar2 = false;
    QMessageLogger::debug((char *)&local_58,"empty header");
  }
  else {
    bVar2 = encodeResponsePseudoHeaders(this,outputStream,header);
    if (bVar2) {
      field_00 = (header->
                 super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pHVar1 = (header->super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = true;
      if (field_00 != pHVar1) {
        do {
          local_58._0_4_ = 0x264385;
          local_58._4_4_ = 0;
          bVar2 = ::operator==(&field_00->name,(char **)&local_58);
          if ((!bVar2) && (bVar2 = encodeHeaderField(this,outputStream,field_00), !bVar2))
          goto LAB_001d9fad;
          field_00 = field_00 + 1;
        } while (field_00 != pHVar1);
        bVar2 = true;
      }
    }
    else {
LAB_001d9fad:
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Encoder::encodeResponse(BitOStream &outputStream, const HttpHeader &header)
{
    if (!header.size()) {
        qDebug("empty header");
        return false;
    }

    if (!encodeResponsePseudoHeaders(outputStream, header))
        return false;

    for (const auto &field : header) {
        if (field.name == ":status")
            continue;

        if (!encodeHeaderField(outputStream, field))
            return false;
    }

    return true;
}